

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int lua_load(lua_State *L,lua_Reader reader,void *data,char *chunkname)

{
  int iVar1;
  undefined1 local_50 [4];
  int status;
  ZIO z;
  char *chunkname_local;
  void *data_local;
  lua_Reader reader_local;
  lua_State *L_local;
  
  z.L = (lua_State *)chunkname;
  if (chunkname == (char *)0x0) {
    z.L = (lua_State *)anon_var_dwarf_1278;
  }
  luaZ_init(L,(ZIO *)local_50,reader,data);
  iVar1 = luaD_protectedparser(L,(ZIO *)local_50,(char *)z.L);
  return iVar1;
}

Assistant:

static int lua_load(lua_State*L,lua_Reader reader,void*data,
const char*chunkname){
ZIO z;
int status;
if(!chunkname)chunkname="?";
luaZ_init(L,&z,reader,data);
status=luaD_protectedparser(L,&z,chunkname);
return status;
}